

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O1

int Cec_ManFraClassesUpdate(Cec_ManFra_t *p,Cec_ManSim_t *pSim,Cec_ManPat_t *pPat,Gia_Man_t *pNew)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Rpr_t GVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  int iVar10;
  Vec_Ptr_t *vInfo;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  Gia_Man_t *pGVar14;
  uint uVar15;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vInfo = Cec_ManPatCollectPatterns(pPat,p->pAig->vCis->nSize,pSim->nWords);
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timePat = p->timePat + lVar13 + lVar12;
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (vInfo != (Vec_Ptr_t *)0x0) {
    local_38 = lVar12;
    Gia_ManCreateValueRefs(p->pAig);
    if (0 < pPat->nSeries) {
      iVar9 = 0;
      do {
        Cec_ManFraCreateInfo(pSim,pSim->vCiSimInfo,vInfo,iVar9);
        iVar10 = Cec_ManSimSimulateRound(pSim,pSim->vCiSimInfo,pSim->vCoSimInfo);
        if (iVar10 != 0) {
          if (vInfo->pArray != (void **)0x0) {
            free(vInfo->pArray);
            vInfo->pArray = (void **)0x0;
          }
          free(vInfo);
          return 1;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < pPat->nSeries);
    }
    if (vInfo->pArray != (void **)0x0) {
      free(vInfo->pArray);
      vInfo->pArray = (void **)0x0;
    }
    free(vInfo);
    lVar12 = local_38;
  }
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar13 + lVar12;
  if (p->vXorNodes->nSize != pNew->vCos->nSize * 2) {
    __assert_fail("Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                  ,0xd5,
                  "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                 );
  }
  if (p->pPars->nDepthMax != 1) {
    Gia_ManCleanMark0(p->pAig);
    Gia_ManCleanMark1(p->pAig);
    pVVar11 = pNew->vCos;
    if (0 < pVVar11->nSize) {
      iVar9 = 0;
      lVar12 = 0;
      do {
        iVar10 = pVVar11->pArray[lVar12];
        if (((long)iVar10 < 0) || (pNew->nObjs <= iVar10)) goto LAB_005d7af8;
        if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
        iVar1 = p->vXorNodes->nSize;
        if ((iVar1 <= iVar9) || (iVar1 <= iVar9 + 1)) goto LAB_005d7b17;
        if (((undefined1  [12])pNew->pObjs[iVar10] & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          uVar2 = p->vXorNodes->pArray[lVar12 * 2 + 1];
          if (((int)uVar2 < 0) || (p->pAig->nObjs <= (int)uVar2)) goto LAB_005d7af8;
          pGVar5 = p->pAig->pObjs + uVar2;
          *(ulong *)pGVar5 = *(ulong *)pGVar5 | 0x40000000;
        }
        lVar12 = lVar12 + 1;
        pVVar11 = pNew->vCos;
        iVar9 = iVar9 + 2;
      } while (lVar12 < pVVar11->nSize);
    }
    pGVar14 = p->pAig;
    if (0 < pGVar14->nObjs) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pGVar5 = pGVar14->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar6 = *(ulong *)(&pGVar5->field_0x0 + lVar12);
        if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
          *(ulong *)(&pGVar5->field_0x0 + lVar12) =
               (*(uint *)((long)pGVar5 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3 + lVar12)
               | *(uint *)((long)pGVar5 +
                          (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3 + lVar12)) & 0x40000000
               | uVar6;
        }
        lVar13 = lVar13 + 1;
        pGVar14 = p->pAig;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < pGVar14->nObjs);
    }
    pVVar11 = pNew->vCos;
    if (0 < pVVar11->nSize) {
      iVar9 = 0;
      lVar12 = 0;
      do {
        iVar10 = pVVar11->pArray[lVar12];
        if (((long)iVar10 < 0) || (pNew->nObjs <= iVar10)) goto LAB_005d7af8;
        if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
        iVar1 = p->vXorNodes->nSize;
        if ((iVar1 <= iVar9) || (iVar1 <= iVar9 + 1)) goto LAB_005d7b17;
        if (((undefined1  [12])pNew->pObjs[iVar10] & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          uVar2 = p->vXorNodes->pArray[lVar12 * 2 + 1];
          if (((int)uVar2 < 0) || (p->pAig->nObjs <= (int)uVar2)) goto LAB_005d7af8;
          pGVar5 = p->pAig->pObjs;
          uVar6 = *(ulong *)(pGVar5 + uVar2);
          if (((uint)uVar6 >> 0x1e & 1) == 0) {
            __assert_fail("pObjOld->fMark0 == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0xef,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar5 = pGVar5 + uVar2;
          if (((pGVar5[-(ulong)((uint)uVar6 & 0x1fffffff)].field_0x3 & 0x40) == 0) &&
             ((pGVar5[-(ulong)((uint)(uVar6 >> 0x20) & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
            *(ulong *)pGVar5 = uVar6 | 0x4000000000000000;
          }
        }
        lVar12 = lVar12 + 1;
        pVVar11 = pNew->vCos;
        iVar9 = iVar9 + 2;
      } while (lVar12 < pVVar11->nSize);
    }
    pGVar14 = p->pAig;
    if (0 < pGVar14->nObjs) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pGVar5 = pGVar14->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar6 = *(ulong *)(&pGVar5->field_0x0 + lVar12);
        if ((uVar6 & 0x4000000080000000) == 0x4000000000000000 && (~(uint)uVar6 & 0x1fffffff) != 0)
        {
          *(ulong *)(&pGVar5->field_0x0 + lVar12) = uVar6 & 0xbfffffff3fffffff;
        }
        lVar13 = lVar13 + 1;
        pGVar14 = p->pAig;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < pGVar14->nObjs);
    }
  }
  p->nAllFailed = 0;
  p->nAllProved = 0;
  p->nAllDisproved = 0;
  pVVar11 = pNew->vCos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      iVar9 = *(int *)((long)pVVar11->pArray + lVar13 * 2);
      if (((long)iVar9 < 0) || (pNew->nObjs <= iVar9)) {
LAB_005d7af8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pNew->pObjs == (Gia_Obj_t *)0x0) {
        return 0;
      }
      iVar10 = p->vXorNodes->nSize;
      if ((iVar10 <= (int)lVar13) || (iVar10 <= (int)lVar13 + 1)) {
LAB_005d7b17:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = p->vXorNodes->pArray;
      uVar2 = piVar7[lVar13];
      if ((int)uVar2 < 0) goto LAB_005d7af8;
      pGVar14 = p->pAig;
      if (pGVar14->nObjs <= (int)uVar2) goto LAB_005d7af8;
      uVar3 = piVar7[lVar13 + 1];
      if (((int)uVar3 < 0) || (pGVar14->nObjs <= (int)uVar3)) goto LAB_005d7af8;
      pGVar8 = pGVar14->pObjs;
      pGVar5 = pGVar8 + uVar2;
      uVar6 = *(ulong *)(pNew->pObjs + iVar9);
      uVar15 = (uint)uVar6;
      if ((uVar6 & 0x4000000000000000) == 0) {
        if ((uVar15 >> 0x1e & 1) == 0) {
          GVar4 = pGVar14->pReprs[uVar3];
          if (((uint)GVar4 >> 0x1d & 1) != 0) {
            __assert_fail("!Gia_ObjFailed(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x11e,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          if (((uint)GVar4 >> 0x1c & 1) != 0) {
            __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x11f,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar14->pReprs[uVar3] = (Gia_Rpr_t)((uint)GVar4 | 0x20000000);
          p->nAllFailed = p->nAllFailed + 1;
        }
        else if (((pGVar5->field_0x3 & 0x40) == 0) && ((pGVar8[uVar3].field_0x3 & 0x40) == 0)) {
          if (uVar2 == ((uint)pGVar14->pReprs[uVar3] & 0xfffffff)) {
            Abc_Print((int)pGVar5,(char *)pGVar14);
          }
          p->nAllDisproved = p->nAllDisproved + 1;
        }
      }
      else {
        if ((uVar15 >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                        ,0x105,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        GVar4 = pGVar14->pReprs[uVar3];
        if (((uint)GVar4 >> 0x1c & 1) != 0) {
          __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                        ,0x106,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        if (((pGVar5->field_0x3 & 0x40) == 0) && ((pGVar8[uVar3].field_0x3 & 0x40) == 0)) {
          if (uVar2 != ((uint)GVar4 & 0xfffffff)) {
            __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x10a,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar14->pReprs[uVar3] = (Gia_Rpr_t)((uint)GVar4 | 0x10000000);
          p->nAllProved = p->nAllProved + 1;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar11 = pNew->vCos;
      lVar13 = lVar13 + 2;
    } while (lVar12 < pVVar11->nSize);
  }
  return 0;
}

Assistant:

int Cec_ManFraClassesUpdate( Cec_ManFra_t * p, Cec_ManSim_t * pSim, Cec_ManPat_t * pPat, Gia_Man_t * pNew )
{
    Vec_Ptr_t * vInfo;
    Gia_Obj_t * pObj, * pObjOld, * pReprOld;
    int i, k, iRepr, iNode;
    abctime clk;
clk = Abc_Clock();
    vInfo = Cec_ManPatCollectPatterns( pPat, Gia_ManCiNum(p->pAig), pSim->nWords );
p->timePat += Abc_Clock() - clk;
clk = Abc_Clock();
    if ( vInfo != NULL )
    {
        Gia_ManCreateValueRefs( p->pAig );
        for ( i = 0; i < pPat->nSeries; i++ )
        {
            Cec_ManFraCreateInfo( pSim, pSim->vCiSimInfo, vInfo, i );
            if ( Cec_ManSimSimulateRound( pSim, pSim->vCiSimInfo, pSim->vCoSimInfo ) )
            {
                Vec_PtrFree( vInfo );
                return 1;
            }
        }
        Vec_PtrFree( vInfo );
    }
p->timeSim += Abc_Clock() - clk;
    assert( Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew) );
    // mark the transitive fanout of failed nodes
    if ( p->pPars->nDepthMax != 1 )
    {
        Gia_ManCleanMark0( p->pAig );
        Gia_ManCleanMark1( p->pAig );
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue;
//            Gia_ManObj(p->pAig, iRepr)->fMark0 = 1;
            Gia_ManObj(p->pAig, iNode)->fMark0 = 1;
        }
        // mark the nodes reachable through the failed nodes
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            pObjOld->fMark0 |= (Gia_ObjFanin0(pObjOld)->fMark0 | Gia_ObjFanin1(pObjOld)->fMark0);
        // unmark the disproved nodes
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue; 
            pObjOld = Gia_ManObj(p->pAig, iNode);
            assert( pObjOld->fMark0 == 1 );
            if ( Gia_ObjFanin0(pObjOld)->fMark0 == 0 && Gia_ObjFanin1(pObjOld)->fMark0 == 0 )
                pObjOld->fMark1 = 1;
        }
        // clean marks
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            if ( pObjOld->fMark1 )
            {
                pObjOld->fMark0 = 0;
                pObjOld->fMark1 = 0;
            }
    }
    // set the results
    p->nAllProved = p->nAllDisproved = p->nAllFailed = 0;
    Gia_ManForEachCo( pNew, pObj, k )
    {
        iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
        iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
        pReprOld = Gia_ManObj(p->pAig, iRepr);
        pObjOld = Gia_ManObj(p->pAig, iNode);
        if ( pObj->fMark1 )
        { // proved
            assert( pObj->fMark0 == 0 );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                assert( iRepr == Gia_ObjRepr(p->pAig, iNode) );
                Gia_ObjSetProved( p->pAig, iNode );
                p->nAllProved++;
            }
        }
        else if ( pObj->fMark0 )
        { // disproved
            assert( pObj->fMark1 == 0 );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                if ( iRepr == Gia_ObjRepr(p->pAig, iNode) )
                    Abc_Print( 1, "Cec_ManFraClassesUpdate(): Error! Node is not refined!\n" );
                p->nAllDisproved++;
            }
        }
        else
        { // failed
            assert( pObj->fMark0 == 0 );
            assert( pObj->fMark1 == 0 );
            assert( !Gia_ObjFailed(p->pAig, iNode) );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            Gia_ObjSetFailed( p->pAig, iNode );
            p->nAllFailed++;
        }
    } 
    return 0;
}